

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_coords(_glist *x,t_symbol *s,int argc,t_atom *argv)

{
  _glist *p_Var1;
  _glist *p_Var2;
  t_float tVar3;
  
  p_Var1 = x;
  do {
    p_Var2 = p_Var1;
    if ((*(ushort *)&p_Var2->field_0xe8 & 0x101) != 0x100) break;
    p_Var1 = p_Var2->gl_owner;
  } while (p_Var2->gl_owner != (_glist *)0x0);
  x->gl_zoom = p_Var2->gl_zoom;
  tVar3 = atom_getfloatarg(0,argc,argv);
  x->gl_x1 = tVar3;
  tVar3 = atom_getfloatarg(1,argc,argv);
  x->gl_y1 = tVar3;
  tVar3 = atom_getfloatarg(2,argc,argv);
  x->gl_x2 = tVar3;
  tVar3 = atom_getfloatarg(3,argc,argv);
  x->gl_y2 = tVar3;
  tVar3 = atom_getfloatarg(4,argc,argv);
  x->gl_pixwidth = (int)tVar3;
  tVar3 = atom_getfloatarg(5,argc,argv);
  x->gl_pixheight = (int)tVar3;
  if (argc >= 8) {
    tVar3 = atom_getfloatarg(7,argc,argv);
    x->gl_xmargin = (int)tVar3;
    tVar3 = atom_getfloatarg(8,argc,argv);
    x->gl_ymargin = (int)tVar3;
  }
  tVar3 = atom_getfloatarg(6,argc,argv);
  canvas_setgraph(x,(int)tVar3,(uint)(argc < 8));
  return;
}

Assistant:

static void canvas_coords(t_glist *x, t_symbol *s, int argc, t_atom *argv)
{
          /* FIXME: this is a stopgap - we should always be using
            glist_getzoom() and never gl_zoom in rest of code. */
    x->gl_zoom = glist_getzoom(x);
    x->gl_x1 = atom_getfloatarg(0, argc, argv);
    x->gl_y1 = atom_getfloatarg(1, argc, argv);
    x->gl_x2 = atom_getfloatarg(2, argc, argv);
    x->gl_y2 = atom_getfloatarg(3, argc, argv);
    x->gl_pixwidth = atom_getfloatarg(4, argc, argv);
    x->gl_pixheight = atom_getfloatarg(5, argc, argv);
    if (argc <= 7)
        canvas_setgraph(x, atom_getfloatarg(6, argc, argv), 1);
    else
    {
        x->gl_xmargin = atom_getfloatarg(7, argc, argv);
        x->gl_ymargin = atom_getfloatarg(8, argc, argv);
        canvas_setgraph(x, atom_getfloatarg(6, argc, argv), 0);
    }
}